

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall sznet::net::Buffer::shrink(Buffer *this,size_t reserve)

{
  size_t sVar1;
  size_type sVar2;
  StringPiece SVar3;
  StringPiece local_70 [2];
  undefined1 local_50 [8];
  Buffer other;
  size_t reserve_local;
  Buffer *this_local;
  
  other.m_wrapSize = reserve;
  Buffer((Buffer *)local_50,4,0x400);
  sVar1 = readableBytes(this);
  ensureWritableBytes((Buffer *)local_50,sVar1 + other.m_wrapSize);
  SVar3 = toStringPiece(this);
  local_70[0].m_ptr = SVar3.m_ptr;
  local_70[0].m_length = SVar3.m_length;
  append((Buffer *)local_50,local_70);
  swap(this,(Buffer *)local_50);
  sVar2 = std::vector<char,_std::allocator<char>_>::capacity(&this->m_buffer);
  this->m_wrapSize = sVar2 * 3 >> 2;
  ~Buffer((Buffer *)local_50);
  return;
}

Assistant:

void shrink(size_t reserve)
	{
		// FIXME: use vector::shrink_to_fit() in C++ 11 if possible.
		Buffer other;
		other.ensureWritableBytes(readableBytes() + reserve);
		other.append(toStringPiece());
		swap(other);
		m_wrapSize = m_buffer.capacity() * 3 / 4;
	}